

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe58At3(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = ((ulong)buf[3] |
          (ulong)buf[4] << 8 |
          (ulong)buf[5] << 0x10 | ((ulong)*(ushort *)(buf + 6) & 0x1fff) << 0x18) << 0x15;
  uVar2 = ((uint)(*buf >> 3) | (uint)buf[1] << 5 | (uint)buf[2] << 0xd) | uVar3;
  uVar1 = uVar2 | 0xfc00000000000000;
  if (uVar3 >> 0x39 == 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe58At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[7];
    res <<= 8;
    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 5;
    res |= (buf[0] >> 3);
    res &= UINT64_C(0x3ffffffffffffff);

    if (res >> 57) {
        res |= UINT64_C(0xfc00000000000000);
    }

    return static_cast<std::int64_t>(res);
}